

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

Abc_Cex_t * Ssw_SmlGetCounterExample(Ssw_Sml_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Abc_Cex_t *p_00;
  uint uVar5;
  int iVar6;
  int i;
  int iVar7;
  Abc_Cex_t *format;
  Aig_Man_t *pAVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  
  if (p->fNonConstOut == 0) {
    __assert_fail("p->fNonConstOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x542,"Abc_Cex_t *Ssw_SmlGetCounterExample(Ssw_Sml_t *)");
  }
  pAVar8 = p->pAig;
  uVar5 = pAVar8->nTruePos;
  iVar2 = -1;
  if ((long)(int)uVar5 < 1) {
    uVar11 = 0;
  }
  else {
    uVar9 = pAVar8->vCos->nSize;
    uVar11 = 0;
    uVar10 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar10 = uVar11;
    }
    do {
      if (uVar11 == uVar10) goto LAB_006aa963;
      iVar7 = p->nWordsTotal;
      iVar3 = p->nWordsPref;
      lVar4 = (long)iVar3;
      if (iVar3 < iVar7) {
        iVar6 = *(int *)((long)pAVar8->vCos->pArray[uVar11] + 0x24);
        lVar12 = 0;
        do {
          if (*(int *)((long)&p[1].pAig + lVar12 * 4 + (long)(iVar7 * iVar6) * 4 + lVar4 * 4) != 0)
          {
            if (iVar7 <= iVar3) goto LAB_006aa7a4;
            lVar12 = 0;
            goto LAB_006aa78b;
          }
          lVar12 = lVar12 + 1;
        } while (iVar7 - iVar3 != (int)lVar12);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (long)(int)uVar5);
    uVar11 = (ulong)uVar5;
  }
  goto LAB_006aa7a4;
  while (uVar9 = uVar9 + 1, uVar9 != 0x20) {
LAB_006aa94b:
    if ((uVar5 >> (uVar9 & 0x1f) & 1) != 0) goto LAB_006aa95c;
  }
  uVar9 = 0xffffffff;
LAB_006aa95c:
  iVar7 = uVar9 + (iVar3 % p->nWordsFrame) * 0x20;
  goto LAB_006aa7a9;
  while (lVar12 = lVar12 + 1, iVar7 - lVar4 != lVar12) {
LAB_006aa78b:
    uVar5 = *(uint *)((long)&p[1].pAig + lVar12 * 4 + (long)(iVar6 * iVar7) * 4 + lVar4 * 4);
    if (uVar5 != 0) {
      iVar3 = iVar3 + (int)lVar12;
      iVar2 = iVar3 / p->nWordsFrame;
      uVar9 = 0;
      goto LAB_006aa94b;
    }
  }
LAB_006aa7a4:
  iVar7 = -1;
LAB_006aa7a9:
  iVar3 = pAVar8->nRegs;
  if (pAVar8->nObjs[3] - iVar3 <= (int)uVar11) {
    __assert_fail("iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x556,"Abc_Cex_t *Ssw_SmlGetCounterExample(Ssw_Sml_t *)");
  }
  if (p->nFrames <= iVar2) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x557,"Abc_Cex_t *Ssw_SmlGetCounterExample(Ssw_Sml_t *)");
  }
  if (p->nWordsFrame * 0x20 <= iVar7) {
    __assert_fail("iBit < 32 * p->nWordsFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x558,"Abc_Cex_t *Ssw_SmlGetCounterExample(Ssw_Sml_t *)");
  }
  p_00 = Abc_CexAlloc(iVar3,pAVar8->nObjs[2] - iVar3,iVar2 + 1);
  p_00->iPo = (int)uVar11;
  p_00->iFrame = iVar2;
  pAVar8 = p->pAig;
  if (0 < pAVar8->nRegs) {
    pVVar1 = pAVar8->vCis;
    uVar5 = 0;
    do {
      uVar9 = pAVar8->nTruePis + uVar5;
      if (((int)uVar9 < 0) || (pVVar1->nSize <= (int)uVar9)) {
LAB_006aa963:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((*(uint *)((long)&p[1].pAig +
                    (long)p->nWordsTotal * (long)*(int *)((long)pVVar1->pArray[uVar9] + 0x24) * 4 +
                    (long)(iVar7 >> 5) * 4) & 1 << ((byte)iVar7 & 0x1f)) != 0) {
        (&p_00[1].iPo)[uVar5 >> 5] = (&p_00[1].iPo)[uVar5 >> 5] | 1 << ((byte)uVar5 & 0x1f);
      }
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < pAVar8->nRegs);
  }
  if (-1 < iVar2) {
    iVar3 = 0;
    do {
      if (0 < pAVar8->nTruePis) {
        pVVar1 = pAVar8->vCis;
        lVar4 = 0;
        do {
          if (pVVar1->nSize <= lVar4) goto LAB_006aa963;
          if ((*(uint *)((long)&p[1].pAig +
                        (long)(p->nWordsFrame * iVar3 * 0x20 + iVar7 >> 5) * 4 +
                        (long)p->nWordsTotal * (long)*(int *)((long)pVVar1->pArray[lVar4] + 0x24) *
                        4) & 1 << ((byte)iVar7 & 0x1f)) != 0) {
            iVar6 = p_00->nPis * iVar3 + p_00->nRegs + (int)lVar4;
            (&p_00[1].iPo)[iVar6 >> 5] = (&p_00[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < pAVar8->nTruePis);
      }
      bVar13 = iVar3 != iVar2;
      iVar3 = iVar3 + 1;
    } while (bVar13);
  }
  format = p_00;
  iVar2 = Saig_ManVerifyCex(pAVar8,p_00);
  if (iVar2 == 0) {
    Abc_Print((int)pAVar8,(char *)format);
    Abc_CexFree(p_00);
    p_00 = (Abc_Cex_t *)0x0;
  }
  return p_00;
}

Assistant:

Abc_Cex_t * Ssw_SmlGetCounterExample( Ssw_Sml_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int iPo, iFrame, iBit, i, k;

    // make sure the simulation manager has it
    assert( p->fNonConstOut );

    // find the first output that failed
    iPo = -1;
    iBit = -1;
    iFrame = -1;
    Saig_ManForEachPo( p->pAig, pObj, iPo )
    {
        if ( Ssw_SmlNodeIsZero(p, pObj) )
            continue;
        pSims = Ssw_ObjSim( p, pObj->Id );
        for ( i = p->nWordsPref; i < p->nWordsTotal; i++ )
            if ( pSims[i] )
            {
                iFrame = i / p->nWordsFrame;
                iBit = 32 * (i % p->nWordsFrame) + Aig_WordFindFirstBit( pSims[i] );
                break;
            }
        break;
    }
    assert( iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig) );
    assert( iFrame < p->nFrames );
    assert( iBit < 32 * p->nWordsFrame );

    // allocate the counter example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig), iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;

    // copy the bit data
    Saig_ManForEachLo( p->pAig, pObj, k )
    {
        pSims = Ssw_ObjSim( p, pObj->Id );
        if ( Abc_InfoHasBit( pSims, iBit ) )
            Abc_InfoSetBit( pCex->pData, k );
    }
    for ( i = 0; i <= iFrame; i++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, k )
        {
            pSims = Ssw_ObjSim( p, pObj->Id );
            if ( Abc_InfoHasBit( pSims, 32 * p->nWordsFrame * i + iBit ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + pCex->nPis * i + k );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        Abc_Print( 1, "Ssw_SmlGetCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}